

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bac.h
# Opt level: O0

int Bac_BoxNtkId(Bac_Ntk_t *p,int i)

{
  int iVar1;
  int i_local;
  Bac_Ntk_t *p_local;
  
  iVar1 = Bac_ObjIsBox(p,i);
  if (iVar1 != 0) {
    iVar1 = Vec_IntEntry(&p->vFanin,i);
    return iVar1;
  }
  __assert_fail("Bac_ObjIsBox(p, i)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                ,0x13d,"int Bac_BoxNtkId(Bac_Ntk_t *, int)");
}

Assistant:

static inline int            Bac_BoxNtkId( Bac_Ntk_t * p, int i )            { assert(Bac_ObjIsBox(p, i)); return Vec_IntEntry(&p->vFanin, i);                             }